

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TcpServer.cpp
# Opt level: O0

void __thiscall
sznet::net::TcpServer::removeConnectionInLoop(TcpServer *this,TcpConnectionPtr *conn)

{
  LogLevel LVar1;
  uint32_t v;
  LogStream *this_00;
  self *psVar2;
  element_type *peVar3;
  string *v_00;
  EventLoop *this_01;
  SourceFile file;
  code *local_1070;
  undefined8 local_1068;
  type local_1060;
  Functor local_1040;
  EventLoop *local_1020;
  EventLoop *ioLoop;
  size_type local_1010;
  size_t n;
  undefined1 local_ff8 [12];
  Logger local_fe8;
  __shared_ptr_access<sznet::net::TcpConnection,_(__gnu_cxx::_Lock_policy)2,_false,_false> *local_18
  ;
  TcpConnectionPtr *conn_local;
  TcpServer *this_local;
  
  local_18 = (__shared_ptr_access<sznet::net::TcpConnection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              *)conn;
  conn_local = (TcpConnectionPtr *)this;
  EventLoop::assertInLoopThread(this->m_loop);
  LVar1 = Logger::logLevel();
  if ((int)LVar1 < 3) {
    Logger::SourceFile::SourceFile<100>
              ((SourceFile *)local_ff8,
               (char (*) [100])
               "/workspace/llm4binary/github/license_all_cmakelists_25/SunshineZzzz[P]sznet/sznet/net/TcpServer.cpp"
              );
    file._12_4_ = 0;
    file.m_data = (char *)local_ff8._0_8_;
    file.m_size = local_ff8._8_4_;
    Logger::Logger(&local_fe8,file,0x60);
    this_00 = Logger::stream(&local_fe8);
    psVar2 = LogStream::operator<<(this_00,"TcpServer::removeConnectionInLoop [");
    psVar2 = LogStream::operator<<(psVar2,&this->m_name);
    psVar2 = LogStream::operator<<(psVar2,"] - connection ");
    peVar3 = std::
             __shared_ptr_access<sznet::net::TcpConnection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->(local_18);
    v_00 = TcpConnection::name_abi_cxx11_(peVar3);
    psVar2 = LogStream::operator<<(psVar2,v_00);
    psVar2 = LogStream::operator<<(psVar2," - ");
    peVar3 = std::
             __shared_ptr_access<sznet::net::TcpConnection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->(local_18);
    v = TcpConnection::id(peVar3);
    LogStream::operator<<(psVar2,v);
    Logger::~Logger(&local_fe8);
  }
  peVar3 = std::
           __shared_ptr_access<sznet::net::TcpConnection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->(local_18);
  ioLoop._4_4_ = TcpConnection::id(peVar3);
  local_1010 = std::
               map<unsigned_int,_std::shared_ptr<sznet::net::TcpConnection>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::shared_ptr<sznet::net::TcpConnection>_>_>_>
               ::erase(&this->m_connections,(key_type *)((long)&ioLoop + 4));
  if (local_1010 == 1) {
    peVar3 = std::
             __shared_ptr_access<sznet::net::TcpConnection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->(local_18);
    this_01 = TcpConnection::getLoop(peVar3);
    local_1070 = TcpConnection::connectDestroyed;
    local_1068 = 0;
    local_1020 = this_01;
    std::bind<void(sznet::net::TcpConnection::*)(),std::shared_ptr<sznet::net::TcpConnection>const&>
              (&local_1060,(offset_in_TcpConnection_to_subr *)&local_1070,
               (shared_ptr<sznet::net::TcpConnection> *)local_18);
    std::function<void()>::
    function<std::_Bind<void(sznet::net::TcpConnection::*(std::shared_ptr<sznet::net::TcpConnection>))()>,void>
              ((function<void()> *)&local_1040,&local_1060);
    EventLoop::queueInLoop(this_01,&local_1040);
    std::function<void_()>::~function(&local_1040);
    std::_Bind<void_(sznet::net::TcpConnection::*(std::shared_ptr<sznet::net::TcpConnection>))()>::
    ~_Bind(&local_1060);
    return;
  }
  __assert_fail("n == 1",
                "/workspace/llm4binary/github/license_all_cmakelists_25/SunshineZzzz[P]sznet/sznet/net/TcpServer.cpp"
                ,100,"void sznet::net::TcpServer::removeConnectionInLoop(const TcpConnectionPtr &)")
  ;
}

Assistant:

void TcpServer::removeConnectionInLoop(const TcpConnectionPtr& conn)
{
	m_loop->assertInLoopThread();
	LOG_INFO << "TcpServer::removeConnectionInLoop [" << m_name
		<< "] - connection " << conn->name() << " - " << conn->id();
	size_t n = m_connections.erase(conn->id());
	(void)n;
	assert(n == 1);
	EventLoop* ioLoop = conn->getLoop();
	ioLoop->queueInLoop(std::bind(&TcpConnection::connectDestroyed, conn));
}